

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strassen-lace.c
# Opt level: O3

void FastNaiveMatrixMultiply
               (REAL *C,REAL *A,REAL *B,uint MatrixSize,uint RowWidthC,uint RowWidthA,uint RowWidthB
               )

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  if (MatrixSize != 0) {
    uVar7 = 0;
    do {
      uVar6 = 0;
      pdVar5 = (double *)((long)B + (ulong)(RowWidthB << 3));
      do {
        pdVar3 = A + 1;
        dVar15 = *A;
        dVar8 = B[uVar6] * dVar15;
        dVar9 = (B + uVar6)[1] * dVar15;
        dVar10 = B[uVar6 + 2] * dVar15;
        dVar11 = (B + uVar6 + 2)[1] * dVar15;
        dVar12 = B[uVar6 + 4] * dVar15;
        dVar13 = (B + uVar6 + 4)[1] * dVar15;
        dVar14 = B[uVar6 + 6] * dVar15;
        dVar15 = (B + uVar6 + 6)[1] * dVar15;
        pdVar4 = pdVar5;
        iVar2 = MatrixSize - 1;
        if (MatrixSize != 1) {
          do {
            dVar1 = *pdVar3;
            dVar8 = dVar8 + *pdVar4 * dVar1;
            dVar9 = dVar9 + pdVar4[1] * dVar1;
            dVar10 = dVar10 + pdVar4[2] * dVar1;
            dVar11 = dVar11 + pdVar4[3] * dVar1;
            dVar12 = dVar12 + pdVar4[4] * dVar1;
            dVar13 = dVar13 + pdVar4[5] * dVar1;
            dVar14 = dVar14 + pdVar4[6] * dVar1;
            dVar15 = dVar15 + pdVar4[7] * dVar1;
            pdVar3 = pdVar3 + 1;
            iVar2 = iVar2 + -1;
            pdVar4 = (double *)((long)pdVar4 + (ulong)(RowWidthB << 3));
          } while (iVar2 != 0);
        }
        A = (REAL *)((long)pdVar3 - (ulong)(MatrixSize * 8));
        *C = dVar8;
        C[1] = dVar9;
        C[2] = dVar10;
        C[3] = dVar11;
        C[4] = dVar12;
        C[5] = dVar13;
        C[6] = dVar14;
        C[7] = dVar15;
        C = C + 8;
        uVar6 = uVar6 + 8;
        pdVar5 = pdVar5 + 8;
      } while (uVar6 < MatrixSize);
      A = (REAL *)((long)A + (ulong)(RowWidthA << 3));
      C = (REAL *)((long)C + (ulong)((RowWidthC - MatrixSize) * 8));
      uVar7 = uVar7 + 1;
    } while (uVar7 != MatrixSize);
  }
  return;
}

Assistant:

void FastNaiveMatrixMultiply(REAL *C, REAL *A, REAL *B,
        unsigned MatrixSize,
        unsigned RowWidthC,
        unsigned RowWidthA,
        unsigned RowWidthB
        )
{ 
    /* Assumes size of real is 8 bytes */
    PTR RowWidthBInBytes = RowWidthB  << 3;
    PTR RowWidthAInBytes = RowWidthA << 3;
    PTR MatrixWidthInBytes = MatrixSize << 3;
    PTR RowIncrementC = ( RowWidthC - MatrixSize) << 3;
    unsigned Horizontal, Vertical;
#ifdef DEBUG_ON
    REAL *OLDC = C;
    REAL *TEMPMATRIX;
#endif

    REAL *ARowStart = A;
    for (Vertical = 0; Vertical < MatrixSize; Vertical++) {
        for (Horizontal = 0; Horizontal < MatrixSize; Horizontal += 8) {
            REAL *BColumnStart = B + Horizontal;
            REAL FirstARowValue = *ARowStart++;

            REAL Sum0 = FirstARowValue * (*BColumnStart);
            REAL Sum1 = FirstARowValue * (*(BColumnStart+1));
            REAL Sum2 = FirstARowValue * (*(BColumnStart+2));
            REAL Sum3 = FirstARowValue * (*(BColumnStart+3));
            REAL Sum4 = FirstARowValue * (*(BColumnStart+4));
            REAL Sum5 = FirstARowValue * (*(BColumnStart+5));
            REAL Sum6 = FirstARowValue * (*(BColumnStart+6));
            REAL Sum7 = FirstARowValue * (*(BColumnStart+7));	

            unsigned Products;
            for (Products = 1; Products < MatrixSize; Products++) {
                REAL ARowValue = *ARowStart++;
                BColumnStart = (REAL*) (((PTR) BColumnStart) + RowWidthBInBytes);

                Sum0 += ARowValue * (*BColumnStart);
                Sum1 += ARowValue * (*(BColumnStart+1));
                Sum2 += ARowValue * (*(BColumnStart+2));
                Sum3 += ARowValue * (*(BColumnStart+3));
                Sum4 += ARowValue * (*(BColumnStart+4));
                Sum5 += ARowValue * (*(BColumnStart+5));
                Sum6 += ARowValue * (*(BColumnStart+6));
                Sum7 += ARowValue * (*(BColumnStart+7));	
            }
            ARowStart = (REAL*) ( ((PTR) ARowStart) - MatrixWidthInBytes);

            *(C) = Sum0;
            *(C+1) = Sum1;
            *(C+2) = Sum2;
            *(C+3) = Sum3;
            *(C+4) = Sum4;
            *(C+5) = Sum5;
            *(C+6) = Sum6;
            *(C+7) = Sum7;
            C+=8;
        }

        ARowStart = (REAL*) ( ((PTR) ARowStart) + RowWidthAInBytes );
        C = (REAL*) ( ((PTR) C) + RowIncrementC );
    }

}